

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
VectorFormatter<DefaultFormatter>::Ser<DataStream,std::vector<CCoin,std::allocator<CCoin>>>
          (VectorFormatter<DefaultFormatter> *this,DataStream *s,
          vector<CCoin,_std::allocator<CCoin>_> *v)

{
  long lVar1;
  bool bVar2;
  vector<CCoin,_std::allocator<CCoin>_> *in_RSI;
  long in_FS_OFFSET;
  value_type *elem;
  vector<CCoin,_std::allocator<CCoin>_> *__range2;
  DefaultFormatter formatter;
  const_iterator __end0;
  const_iterator __begin0;
  DataStream *in_stack_ffffffffffffffa8;
  reference in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CCoin,_std::allocator<CCoin>_>::size
            ((vector<CCoin,_std::allocator<CCoin>_> *)in_stack_ffffffffffffffa8);
  WriteCompactSize<DataStream>((DataStream *)in_stack_ffffffffffffffb8,(uint64_t)in_RSI);
  std::vector<CCoin,_std::allocator<CCoin>_>::begin(in_RSI);
  std::vector<CCoin,_std::allocator<CCoin>_>::end(in_RSI);
  while( true ) {
    bVar2 = __gnu_cxx::operator==<const_CCoin_*,_std::vector<CCoin,_std::allocator<CCoin>_>_>
                      ((__normal_iterator<const_CCoin_*,_std::vector<CCoin,_std::allocator<CCoin>_>_>
                        *)in_stack_ffffffffffffffb8,
                       (__normal_iterator<const_CCoin_*,_std::vector<CCoin,_std::allocator<CCoin>_>_>
                        *)in_RSI);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffb8 =
         __gnu_cxx::__normal_iterator<const_CCoin_*,_std::vector<CCoin,_std::allocator<CCoin>_>_>::
         operator*((__normal_iterator<const_CCoin_*,_std::vector<CCoin,_std::allocator<CCoin>_>_> *)
                   in_stack_ffffffffffffffa8);
    DefaultFormatter::Ser<DataStream,CCoin>(in_stack_ffffffffffffffa8,(CCoin *)0x1269e13);
    __gnu_cxx::__normal_iterator<const_CCoin_*,_std::vector<CCoin,_std::allocator<CCoin>_>_>::
    operator++((__normal_iterator<const_CCoin_*,_std::vector<CCoin,_std::allocator<CCoin>_>_> *)
               in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }